

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void CaDiCaL::Options::initialize_from_environment(int *val,char *name,int L,int H)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int *in_RDI;
  char *val_str;
  char *p;
  char *q;
  char key [80];
  char *local_78;
  char *local_70;
  char local_68 [24];
  int *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  local_70 = local_68;
  for (local_78 = "CADICAL_"; pcVar3 = in_RSI, *local_78 != '\0'; local_78 = local_78 + 1) {
    *local_70 = *local_78;
    local_70 = local_70 + 1;
  }
  while (local_78 = pcVar3, *local_78 != '\0') {
    iVar2 = toupper((int)*local_78);
    *local_70 = (char)iVar2;
    local_70 = local_70 + 1;
    pcVar3 = local_78 + 1;
  }
  *local_70 = '\0';
  pcVar3 = getenv(local_68);
  if ((pcVar3 != (char *)0x0) &&
     (bVar1 = parse_int_str(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0), bVar1)) {
    if (*in_RDI < in_EDX) {
      *in_RDI = in_EDX;
    }
    if (in_ECX < *in_RDI) {
      *in_RDI = in_ECX;
    }
  }
  return;
}

Assistant:

void Options::initialize_from_environment (int &val, const char *name,
                                           const int L, const int H) {
  char key[80], *q;
  const char *p;
  assert (strlen (name) + strlen ("CADICAL_") + 1 < sizeof (key));
  for (p = "CADICAL_", q = key; *p; p++)
    *q++ = *p;
  for (p = name; *p; p++)
    *q++ = toupper (*p);
  assert (q < key + sizeof (key));
  *q = 0;
  const char *val_str = getenv (key);
  if (!val_str)
    return;
  if (!parse_int_str (val_str, val))
    return;
  if (val < L)
    val = L;
  if (val > H)
    val = H;
}